

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplewidgets.cpp
# Opt level: O1

QAccessibleInterface * __thiscall
QAccessibleToolButton::child(QAccessibleToolButton *this,int index)

{
  QToolButton *pQVar1;
  QMenu *pQVar2;
  QObject *pQVar3;
  QAccessibleInterface *pQVar4;
  
  if (index == 0) {
    (**(code **)(*(long *)&(this->super_QAccessibleButton).super_QAccessibleWidget + 0x18))();
    pQVar1 = (QToolButton *)QMetaObject::cast((QObject *)&QToolButton::staticMetaObject);
    pQVar2 = QToolButton::menu(pQVar1);
    if (pQVar2 != (QMenu *)0x0) {
      (**(code **)(*(long *)&(this->super_QAccessibleButton).super_QAccessibleWidget + 0x18))(this);
      pQVar1 = (QToolButton *)QMetaObject::cast((QObject *)&QToolButton::staticMetaObject);
      pQVar3 = (QObject *)QToolButton::menu(pQVar1);
      pQVar4 = (QAccessibleInterface *)QAccessible::queryAccessibleInterface(pQVar3);
      return pQVar4;
    }
  }
  return (QAccessibleInterface *)0x0;
}

Assistant:

QAccessibleInterface *QAccessibleToolButton::child(int index) const
{
#if QT_CONFIG(menu)
    if (index == 0 && toolButton()->menu())
    {
        return QAccessible::queryAccessibleInterface(toolButton()->menu());
    }
#else
    Q_UNUSED(index);
#endif
    return nullptr;
}